

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hash_table.cpp
# Opt level: O2

void __thiscall
ON_Hash32Table::Internal_AdjustTableCapacity(ON_Hash32Table *this,ON__UINT32 item_count)

{
  ON_Hash32TableItem *pOVar1;
  ulong uVar2;
  uint uVar3;
  ON_Hash32TableItem **__s;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ON_Hash32TableItem *pOVar7;
  
  uVar3 = this->m_hash_table_capacity;
  if (uVar3 < 0x40000) {
    uVar6 = item_count >> 3;
    if (uVar3 <= uVar6) {
      uVar4 = 0x40;
      if (0x40 < uVar3) {
        uVar4 = (ulong)uVar3;
      }
      uVar3 = 0x40000;
      if (uVar6 < 0x40000) {
        uVar3 = uVar6;
      }
      do {
        uVar5 = uVar4;
        uVar6 = (uint)uVar5;
        uVar4 = (ulong)(uVar6 * 2);
      } while (uVar6 < uVar3);
      __s = (ON_Hash32TableItem **)onmalloc(uVar5 << 3);
      memset(__s,0,uVar5 << 3);
      if (this->m_item_count != 0) {
        uVar3 = this->m_hash_table_capacity;
        for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
          pOVar7 = this->m_hash_table[uVar4];
          while (pOVar7 != (ON_Hash32TableItem *)0x0) {
            pOVar1 = pOVar7->m_internal_next;
            uVar2 = (ulong)pOVar7->m_internal_hash32 % uVar5;
            pOVar7->m_internal_next = __s[uVar2];
            __s[uVar2] = pOVar7;
            pOVar7 = pOVar1;
          }
        }
        onfree(this->m_hash_table);
      }
      this->m_hash_table = __s;
      this->m_hash_table_capacity = uVar6;
    }
  }
  return;
}

Assistant:

void ON_Hash32Table::Internal_AdjustTableCapacity(
  ON__UINT32 item_count
  )
{
  const ON__UINT32 max_capacity = 256 * 1024;
  const ON__UINT32 target_list_length = 8;
  if (m_hash_table_capacity < max_capacity && item_count/target_list_length >= m_hash_table_capacity)
  {
    ON__UINT32 hash_table_capacity = m_hash_table_capacity;
    if (hash_table_capacity < 64)
      hash_table_capacity = 64;
    while (hash_table_capacity < max_capacity && item_count/target_list_length > hash_table_capacity)
      hash_table_capacity *= 2;

    size_t sizeof_hash_table = hash_table_capacity*sizeof(m_hash_table[0]);
    ON_Hash32TableItem** hash_table = (ON_Hash32TableItem**)onmalloc(sizeof_hash_table);
    memset(hash_table,0,sizeof_hash_table);
    if (m_item_count > 0)
    {
      for (ON__UINT32 i = 0; i < m_hash_table_capacity; i++)
      {
        ON_Hash32TableItem* item = m_hash_table[i];
        while (nullptr != item)
        {
          ON_Hash32TableItem* next = item->m_internal_next;
          const ON__UINT32 j = item->m_internal_hash32 % hash_table_capacity;
          item->m_internal_next = hash_table[j];
          hash_table[j] = item;
          item = next;
        }
      }
      onfree(m_hash_table);
    }
    m_hash_table = hash_table;
    m_hash_table_capacity = hash_table_capacity;
  }
}